

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O0

void __thiscall Fl_Widget::label(Fl_Widget *this,char *a)

{
  uint uVar1;
  char *a_local;
  Fl_Widget *this_local;
  
  uVar1 = flags(this);
  if ((uVar1 & 0x400) != 0) {
    if ((this->label_).value == a) {
      return;
    }
    free((this->label_).value);
    clear_flag(this,0x400);
  }
  (this->label_).value = a;
  redraw_label(this);
  return;
}

Assistant:

void
Fl_Widget::label(const char *a) {
  if (flags() & COPIED_LABEL) {
    // reassigning a copied label remains the same copied label
    if (label_.value == a)
      return;
    free((void *)(label_.value));
    clear_flag(COPIED_LABEL);
  }
  label_.value=a;
  redraw_label();
}